

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.hpp
# Opt level: O2

int __thiscall
sp::template_classifier::compare_(template_classifier *this,Mat *tem,Mat *true_sample)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  iVar3 = (this->fixed_sz).width;
  iVar5 = (this->fixed_sz).height;
  if (((byte)tem[1] & 0x40) != 0) {
    iVar4 = 1;
    iVar7 = iVar5;
    if (((byte)true_sample[1] & 0x40) != 0) {
      iVar7 = 1;
      iVar4 = iVar5;
    }
    iVar5 = iVar7;
    iVar3 = iVar3 * iVar4;
  }
  iVar4 = 0;
  for (iVar7 = 0; iVar7 != iVar5; iVar7 = iVar7 + 1) {
    for (lVar8 = 0; iVar3 != (int)lVar8; lVar8 = lVar8 + 1) {
      cVar1 = *(char *)(**(long **)(tem + 0x48) * (long)iVar7 + *(long *)(tem + 0x10) + lVar8);
      cVar2 = *(char *)((long)iVar7 * **(long **)(true_sample + 0x48) +
                        *(long *)(true_sample + 0x10) + lVar8);
      uVar6 = (cVar2 != '\0' && cVar1 != '\0') - 1 | 3;
      if (cVar1 == '\0' && cVar2 == '\0') {
        uVar6 = 0;
      }
      iVar4 = iVar4 + uVar6;
    }
  }
  return iVar4;
}

Assistant:

inline int        compare_(cv::Mat& tem, cv::Mat& true_sample)
	{
		uint32_t iter_rows = fixed_sz.height;
	    uint32_t iter_cols = fixed_sz.width;
	    auto sum_pixel = iter_rows * iter_cols;
		if(tem.isContinuous() && true_sample.isContinuous())
	   	{
			iter_cols = sum_pixel;
			iter_rows = 1;
		}
		int same_cnt = 0;
		for (uint32_t i = 0; i < iter_rows; ++i)
		{
			const uchar* lhs = tem.ptr<uchar>(i);
			const uchar* rhs = true_sample.ptr<uchar>(i);
			for (uint32_t j = 0; j < iter_cols; ++j)
			{
		    	bool l = *lhs++, r = *rhs++;
		    	if(!l && !r)
		        	continue;
		    	same_cnt += (l && r) ? 3 : -1;
			}
		}
	    return same_cnt;
	}